

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O0

void __thiscall
Js::AsmJsFunctionDeclaration::SetArgCount(AsmJsFunctionDeclaration *this,ArgSlot count)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  AsmJsType *pAVar5;
  TrackAllocData local_40;
  ArgSlot local_12;
  AsmJsFunctionDeclaration *pAStack_10;
  ArgSlot count_local;
  AsmJsFunctionDeclaration *this_local;
  
  local_12 = count;
  pAStack_10 = this;
  if (this->mArgumentsType != (AsmJsType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                ,0x1e9,"(mArgumentsType == nullptr)","mArgumentsType == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->mArgCount != 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                ,0x1ea,"(mArgCount == Constants::InvalidArgSlot)",
                                "mArgCount == Constants::InvalidArgSlot");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (local_12 == 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
                                ,0x1eb,"(count != Constants::InvalidArgSlot)",
                                "count != Constants::InvalidArgSlot");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->mArgCount = local_12;
  if (local_12 != 0) {
    pAVar4 = &this->mAllocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&AsmJsType::typeinfo,0,(ulong)local_12,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
               ,0x1ef);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_40);
    pAVar5 = Memory::AllocateArray<Memory::ArenaAllocator,Js::AsmJsType,false>
                       ((Memory *)pAVar4,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,
                        (ulong)local_12);
    this->mArgumentsType = pAVar5;
  }
  return;
}

Assistant:

void AsmJsFunctionDeclaration::SetArgCount(ArgSlot count )
    {
        Assert( mArgumentsType == nullptr );
        Assert(mArgCount == Constants::InvalidArgSlot);
        Assert(count != Constants::InvalidArgSlot);
        mArgCount = count;
        if( count > 0 )
        {
            mArgumentsType = AnewArrayZ( mAllocator, AsmJsType, count );
        }
    }